

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

void __thiscall
QXmlStreamWriter::writeAttribute(QXmlStreamWriter *this,QXmlStreamAttribute *attribute)

{
  ulong uVar1;
  QAnyStringView value;
  long in_FS_OFFSET;
  QAnyStringView namespaceUri;
  QAnyStringView qualifiedName;
  QAnyStringView name;
  QAnyStringView value_00;
  
  uVar1 = (attribute->m_namespaceUri).m_string.size;
  if (uVar1 == 0) {
    qualifiedName.m_size = (attribute->m_qualifiedName).m_string.size | 0x8000000000000000;
    value_00.m_size = (attribute->m_value).m_string.size | 0x8000000000000000;
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      qualifiedName.field_0.m_data_utf16 = (attribute->m_qualifiedName).m_string.ptr;
      value_00.field_0.m_data_utf16 = (attribute->m_value).m_string.ptr;
      writeAttribute(this,qualifiedName,value_00);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    namespaceUri.m_size = uVar1 | 0x8000000000000000;
    value.m_size = (attribute->m_value).m_string.size | 0x8000000000000000;
    value.field_0.m_data_utf16 = (attribute->m_value).m_string.ptr;
    namespaceUri.field_0.m_data_utf16 = (attribute->m_namespaceUri).m_string.ptr;
    name.m_size = (attribute->m_name).m_string.size | 0x8000000000000000;
    name.field_0.m_data_utf16 = (attribute->m_name).m_string.ptr;
    writeAttribute(this,namespaceUri,name,value);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamWriter::writeAttribute(const QXmlStreamAttribute& attribute)
{
    if (attribute.namespaceUri().isEmpty())
        writeAttribute(attribute.qualifiedName(), attribute.value());
    else
        writeAttribute(attribute.namespaceUri(), attribute.name(), attribute.value());
}